

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::BNTest_MillerRabinIteration_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::BNTest_MillerRabinIteration_Test> *this)

{
  BNTest *this_00;
  
  this_00 = (BNTest *)operator_new(0x18);
  anon_unknown.dwarf_3a28a9::BNTest::BNTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__BNTest_00682090;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }